

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEC.h
# Opt level: O3

Estimates * SEC(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  VertexIdx *pVVar1;
  double dVar2;
  VertexIdx v2;
  EdgeInfo e_struct;
  Parameters params_00;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [8];
  uint uVar6;
  EdgeIdx *pEVar7;
  ulong uVar8;
  ulong *puVar9;
  size_t __i;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  int iVar15;
  byte bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  Estimates edge_count_output;
  random_device rd;
  mt19937 mt;
  ulong in_stack_ffffffffffffc2c8;
  undefined8 in_stack_ffffffffffffc2d0;
  undefined8 in_stack_ffffffffffffc2d8;
  undefined1 in_stack_ffffffffffffc2e0 [144];
  undefined1 local_29a0 [16];
  undefined1 local_2990 [8];
  undefined1 auStack_2988 [32];
  undefined1 local_2968 [8];
  undefined1 auStack_2960 [40];
  long lStack_2938;
  ulong local_2930;
  double local_2928;
  long local_2920;
  long local_2918;
  long local_2910;
  double local_2908;
  OrderedEdgeCollection local_2900;
  Estimates local_2888;
  void *local_2868;
  undefined4 uStack_2860;
  undefined4 uStack_285c;
  ulong *local_2858;
  undefined4 uStack_2850;
  undefined4 uStack_284c;
  long local_2848;
  undefined8 local_2840;
  undefined4 uStack_2838;
  undefined4 uStack_2834;
  ulong *local_2830;
  undefined4 uStack_2828;
  undefined4 uStack_2824;
  long local_2820;
  long local_2818;
  long local_2810;
  long lStack_2808;
  EdgeIdx EStack_2800;
  long local_27f8;
  EdgeIdx EStack_27f0;
  Parameters local_27e8;
  random_device local_2740;
  ulong local_13b8 [624];
  undefined8 local_38;
  
  bVar16 = 0;
  auStack_2988._16_8_ = 0;
  auStack_2988._24_8_ = auStack_2988._24_8_ & 0xffffffff00000000;
  auStack_2960._16_8_ = 0;
  auStack_2960._24_8_ = auStack_2960._24_8_ & 0xffffffff00000000;
  local_29a0 = (undefined1  [16])0x0;
  _local_2990 = (undefined1  [16])0x0;
  auStack_2988._8_8_ = auStack_2988._8_8_ & 0xffffffff00000000;
  _local_2968 = (undefined1  [16])0x0;
  auStack_2960._8_8_ = auStack_2960._8_8_ & 0xffffffff00000000;
  stack0xffffffffffffd6c0 = (undefined1  [16])0x0;
  std::random_device::random_device(&local_2740);
  uVar6 = std::random_device::_M_getval();
  uVar13 = (ulong)uVar6;
  local_13b8[0] = uVar13;
  lVar10 = 1;
  do {
    uVar13 = (ulong)(((uint)(uVar13 >> 0x1e) ^ (uint)uVar13) * 0x6c078965 + (int)lVar10);
    local_13b8[lVar10] = uVar13;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x270);
  local_38 = 0x270;
  puVar9 = local_13b8;
  puVar14 = (ulong *)&stack0xffffffffffffc2c8;
  for (lVar10 = 0x271; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar14 = *puVar9;
    puVar9 = puVar9 + (ulong)bVar16 * -2 + 1;
    puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
  }
  GetEdgesByUniSampling(&local_2888,cg,params);
  dVar17 = local_2888.estimate;
  iVar15 = (int)lVar10;
  uVar4 = local_29a0._0_8_;
  auVar5 = local_2990;
  local_29a0._8_8_ = local_2888.fraction_of_edges_seen;
  local_29a0._0_8_ = local_2888.fraction_of_vertices_seen;
  local_2990 = (undefined1  [8])local_2888.query_complexity;
  local_2888.fraction_of_vertices_seen = 0.0;
  local_2888.fraction_of_edges_seen = 0.0;
  local_2888.query_complexity = 0.0;
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)auVar5 - uVar4);
  }
  if ((void *)auStack_2988._0_8_ != (void *)0x0) {
    operator_delete((void *)auStack_2988._0_8_,(long)local_2968 - auStack_2988._0_8_);
  }
  local_2968 = (undefined1  [8])local_2848;
  auVar19 = _local_2968;
  auStack_2988._8_8_ = CONCAT44(uStack_285c,uStack_2860);
  auStack_2988._24_8_ = CONCAT44(uStack_284c,uStack_2850);
  auStack_2988._16_8_ = local_2858;
  auStack_2988._0_8_ = local_2868;
  local_2868 = (void *)0x0;
  uStack_2860 = 0;
  local_2858 = (ulong *)0x0;
  uStack_2850 = 0;
  local_2848 = 0;
  if ((void *)auStack_2960._0_8_ != (void *)0x0) {
    _local_2968 = auVar19;
    operator_delete((void *)auStack_2960._0_8_,auStack_2960._32_8_ - auStack_2960._0_8_);
  }
  auStack_2960._32_8_ = local_2820;
  auStack_2960._8_8_ = CONCAT44(uStack_2834,uStack_2838);
  auStack_2960._24_8_ = CONCAT44(uStack_2824,uStack_2828);
  auStack_2960._16_8_ = local_2830;
  auStack_2960._0_8_ = local_2840;
  local_2840 = 0;
  uStack_2838 = 0;
  local_2830 = (ulong *)0x0;
  uStack_2828 = 0;
  local_2820 = 0;
  lStack_2938 = local_2818;
  if (local_2868 != (void *)0x0) {
    operator_delete(local_2868,local_2848 - (long)local_2868);
    local_2868 = (void *)0x0;
    uStack_2860 = 0;
    local_2858 = (ulong *)0x0;
    uStack_2850 = 0;
    local_2848 = 0;
  }
  if ((void *)local_2888.fraction_of_vertices_seen != (void *)0x0) {
    operator_delete((void *)local_2888.fraction_of_vertices_seen,
                    (long)local_2888.query_complexity - (long)local_2888.fraction_of_vertices_seen);
  }
  if (params->normalization_count_available == false) {
    local_2900.no_of_edges = (EdgeIdx)dVar17;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              (&local_2900.edge_list,(vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)local_29a0
              );
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_2900.visited_edge_set,(vector<bool,_std::allocator<bool>_> *)(local_2990 + 8))
    ;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_2900.visited_vertex_set,
               (vector<bool,_std::allocator<bool>_> *)(local_2968 + 8));
    local_2900.no_of_query = lStack_2938;
    Parameters::Parameters(&local_27e8,params);
    params_00.filename._M_string_length = in_stack_ffffffffffffc2d0;
    params_00.filename._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc2c8;
    params_00.filename.field_2._M_allocated_capacity = in_stack_ffffffffffffc2d8;
    params_00._24_144_ = in_stack_ffffffffffffc2e0;
    EstimateEdgeCount(&local_2888,cg,&local_2900,params_00,iVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_27e8.out_directory._M_dataplus._M_p != &local_27e8.out_directory.field_2) {
      operator_delete(local_27e8.out_directory._M_dataplus._M_p,
                      local_27e8.out_directory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_27e8.algo_name._M_dataplus._M_p != &local_27e8.algo_name.field_2) {
      operator_delete(local_27e8.algo_name._M_dataplus._M_p,
                      local_27e8.algo_name.field_2._M_allocated_capacity + 1);
    }
    if (local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_27e8.filename._M_dataplus._M_p != &local_27e8.filename.field_2) {
      operator_delete(local_27e8.filename._M_dataplus._M_p,
                      local_27e8.filename.field_2._M_allocated_capacity + 1);
    }
    if (local_2900.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_2900.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_2900.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_2900.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     );
      local_2900.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2900.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_2900.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2900.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_2900.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_2900.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_2900.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl
                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_2900.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_2900.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
      ;
      local_2900.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2900.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_2900.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2900.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_2900.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_2900.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2900.edge_list.
                      super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2900.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2900.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    local_2888.estimate = (double)cg->nEdges;
  }
  lVar10 = (long)(local_29a0._8_8_ - local_29a0._0_8_) >> 5;
  dVar17 = 0.0;
  dVar20 = 0.0;
  if (0 < lVar10) {
    local_2930 = (ulong)((int)((lVar10 - 1U) / 500) + 1);
    lVar11 = 0;
    local_2928 = local_2888.estimate;
    local_2920 = lVar10;
    do {
      lVar10 = ((pointer)(local_29a0._0_8_ + lVar11 * 0x20))->u;
      lStack_2808 = ((pointer)(local_29a0._0_8_ + lVar11 * 0x20))->v;
      EStack_2800 = (&((pointer)(local_29a0._0_8_ + lVar11 * 0x20))->v)[1];
      e_struct.dest = lStack_2808;
      e_struct.src = lVar10;
      e_struct.index = EStack_2800;
      local_2910 = lVar11;
      local_2908 = dVar20;
      local_2810 = lVar10;
      local_27f8 = lStack_2808;
      EStack_27f0 = EStack_2800;
      local_2918 = TriangleByEdge(cg,e_struct);
      pEVar7 = cg->offsets;
      lVar11 = lVar10;
      v2 = local_27f8;
      if (pEVar7[local_27f8 + 1] - pEVar7[local_27f8] < pEVar7[lVar10 + 1] - pEVar7[lVar10]) {
        lVar11 = local_27f8;
        v2 = lVar10;
      }
      for (uVar13 = pEVar7[lVar11]; (long)uVar13 < pEVar7[lVar11 + 1]; uVar13 = uVar13 + 1) {
        pVVar1 = cg->nbors;
        uVar8 = pVVar1[uVar13];
        uVar12 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar12 = uVar8;
        }
        puVar9 = (ulong *)(auStack_2960._0_8_ +
                          (((long)uVar12 >> 6) +
                          ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8);
        *puVar9 = *puVar9 | 1L << ((byte)uVar8 & 0x3f);
        uVar8 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar8 = uVar13;
        }
        puVar9 = (ulong *)(auStack_2988._0_8_ +
                          (((long)uVar8 >> 6) +
                          ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8);
        *puVar9 = *puVar9 | 1L << ((byte)uVar13 & 0x3f);
        uVar8 = Escape::CGraph::getEdgeBinary(cg,pVVar1[uVar13],v2);
        if (uVar8 != 0xffffffffffffffff) {
          uVar12 = uVar8 + 0x3f;
          if (-1 < (long)uVar8) {
            uVar12 = uVar8;
          }
          puVar9 = (ulong *)(auStack_2988._0_8_ +
                            (((long)uVar12 >> 6) +
                            ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8);
          *puVar9 = *puVar9 | 1L << ((byte)uVar8 & 0x3f);
        }
        lStack_2938 = lStack_2938 + 2;
        pEVar7 = cg->offsets;
      }
      dVar20 = local_2908 + (double)local_2918;
      lVar11 = local_2910 + 500;
    } while (lVar11 < local_2920);
    dVar17 = (double)(int)local_2930 * 6.0;
    local_2888.estimate = local_2928;
  }
  dVar2 = 0.0;
  __return_storage_ptr__->estimate = (local_2888.estimate / dVar17) * dVar20;
  if (auStack_2988._24_4_ != 0 || auStack_2988._0_8_ != auStack_2988._16_8_) {
    lVar10 = 0;
    uVar13 = 0;
    puVar9 = (ulong *)auStack_2988._0_8_;
    do {
      lVar10 = lVar10 + (ulong)((*puVar9 >> (uVar13 & 0x3f) & 1) != 0);
      iVar15 = (int)uVar13;
      puVar9 = puVar9 + (iVar15 == 0x3f);
      uVar13 = (ulong)(iVar15 + 1);
      if (iVar15 == 0x3f) {
        uVar13 = 0;
      }
    } while ((int)uVar13 != auStack_2988._24_4_ || puVar9 != (ulong *)auStack_2988._16_8_);
    dVar2 = (double)lVar10 * 100.0;
  }
  dVar17 = 0.0;
  if (auStack_2960._24_4_ != 0 || auStack_2960._0_8_ != auStack_2960._16_8_) {
    lVar10 = 0;
    uVar13 = 0;
    puVar9 = (ulong *)auStack_2960._0_8_;
    do {
      lVar10 = lVar10 + (ulong)((*puVar9 >> (uVar13 & 0x3f) & 1) != 0);
      iVar15 = (int)uVar13;
      puVar9 = puVar9 + (iVar15 == 0x3f);
      uVar13 = (ulong)(iVar15 + 1);
      if (iVar15 == 0x3f) {
        uVar13 = 0;
      }
    } while ((int)uVar13 != auStack_2960._24_4_ || puVar9 != (ulong *)auStack_2960._16_8_);
    dVar17 = (double)lVar10 * 100.0;
  }
  dVar20 = (double)cg->nEdges;
  auVar18._8_8_ = dVar2;
  auVar18._0_8_ = dVar17;
  auVar19._8_4_ = SUB84(dVar20,0);
  auVar19._0_8_ = (double)cg->nVertices;
  auVar19._12_4_ = (int)((ulong)dVar20 >> 0x20);
  auVar19 = divpd(auVar18,auVar19);
  __return_storage_ptr__->fraction_of_vertices_seen = (double)auVar19._0_8_;
  __return_storage_ptr__->fraction_of_edges_seen = (double)auVar19._8_8_;
  __return_storage_ptr__->query_complexity = ((double)lStack_2938 * 100.0) / dVar20;
  std::random_device::_M_fini();
  if ((void *)auStack_2960._0_8_ != (void *)0x0) {
    operator_delete((void *)auStack_2960._0_8_,auStack_2960._32_8_ - auStack_2960._0_8_);
    auStack_2960._0_8_ = 0;
    auStack_2960._8_8_ = auStack_2960._8_8_ & 0xffffffff00000000;
    auStack_2960._16_8_ = (ulong *)0x0;
    auStack_2960._24_8_ = auStack_2960._24_8_ & 0xffffffff00000000;
    auStack_2960._32_8_ = 0;
  }
  if ((void *)auStack_2988._0_8_ != (void *)0x0) {
    operator_delete((void *)auStack_2988._0_8_,(long)local_2968 - auStack_2988._0_8_);
    auStack_2988._0_8_ = 0;
    auStack_2988._8_8_ = auStack_2988._8_8_ & 0xffffffff00000000;
    auStack_2988._16_8_ = (ulong *)0x0;
    auStack_2988._24_8_ = auStack_2988._24_8_ & 0xffffffff00000000;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auStack_2960._0_8_;
    _local_2968 = auVar3 << 0x40;
  }
  if ((pointer)local_29a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_29a0._0_8_,(long)local_2990 - local_29a0._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Estimates SEC(CGraph *cg, Parameters params)
{
    /**
    * Set up local variables. skip parameter is used in estimating the number of edges in the graph.
    */
    OrderedEdgeCollection randomEdgeCollection;
    double running_count = 0.0, edge_estimate=0.0;
    int skip = 1;

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Perform a random walk through the graph, and collect the edges in the process
     * The fourth parameter is set to false to indicate that we do not care about the
     * vertex ordering of each edge
     */
    randomEdgeCollection = GetEdgesByUniSampling(cg, params, mt);

    /**
     * Depending on whether the total number of edges in the graphs is available or not, compute it.
     */
    if (!params.normalization_count_available) {
        Estimates edge_count_output = EstimateEdgeCount(cg, randomEdgeCollection, params, skip);
        edge_estimate = edge_count_output.estimate;
    }
    else
        edge_estimate = cg->nEdges *1.0;

    /** We now go over the edges collected by the random walk and count the
     * number of triangles incident on each edge.
     * However, we can not do this for every edge as it would be too expensive.
     * Instead, we perform this task for a small fraction of the total edges in the random walk
     */
    int sparsity = 500, no_of_samples=0;
    EdgeIdx total_edge = randomEdgeCollection.edge_list.size();

    for (VertexIdx i=0; i<total_edge; i=i+sparsity) {
        EdgeInfo e_struct;
        VertexIdx parent,child;
        parent = randomEdgeCollection.edge_list[i].u;
        child = randomEdgeCollection.edge_list[i].v;

        e_struct.index = randomEdgeCollection.edge_list[i].index;
        e_struct.src = parent;
        e_struct.dest = child;
        running_count += TriangleByEdge(cg,e_struct);
        no_of_samples++;
        /**
         * Now for the vertex with lesser degree, we visit all of its neighbors
         * and all the incident edges on it we copy the lower degree vertex in src.
         * Update relevant data structure and also update query complexity
         */
        VertexIdx src,dst;
        if (cg->degree(parent) > cg-> degree(child)) {
            src = child;
            dst = parent;
        }
        else {
            src = parent;
            dst = child;
        }
        for (EdgeIdx idx = cg->offsets[src]; idx <cg->offsets[src+1];idx++ ) {
            randomEdgeCollection.visited_vertex_set[cg->nbors[idx]] = true;
            randomEdgeCollection.visited_edge_set[idx] = true;
            EdgeIdx e2 = cg->getEdgeBinary(cg->nbors[idx],dst);
            if (e2!= -1) {
                randomEdgeCollection.visited_edge_set[e2] = true;
            }
            randomEdgeCollection.no_of_query = randomEdgeCollection.no_of_query + 2;
        }
    }



    double scale = 1.0* edge_estimate / (6.0*no_of_samples);
    double triangleEstimate = running_count * scale ;
    //printf("p=%lf,  scale = %lf \n",p,scale);
//    printf ("Multi: %lld,  %lf\n",visited_edge_set.size(),triangleEstimate);

    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(randomEdgeCollection.visited_edge_set.begin(),randomEdgeCollection.visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(randomEdgeCollection.visited_vertex_set.begin(),randomEdgeCollection.visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / cg->nVertices;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / cg->nEdges;
    return_estimate.query_complexity = randomEdgeCollection.no_of_query * 100.0 /cg->nEdges;

    //    return_estimate.fraction_of_vertices_seen = visited_with_nbor_vertex_set.size() * 100.0 / n;
//    return_estimate.fraction_of_edges_seen = visited_with_nbor_edge_set.size() * 100.0 / m;
    // Why the multiplication by 2? The fraction of edges seen is effectively
    // compared against all the entries in the adjacency list, which is 2m.

    return return_estimate;
}